

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gz_avail(gz_statep state)

{
  int iVar1;
  z_streamp strm;
  gz_statep state_local;
  
  if (state->err == 0) {
    if (state->eof == 0) {
      iVar1 = gz_load(state,state->in,state->size,&(state->strm).avail_in);
      if (iVar1 == -1) {
        return -1;
      }
      (state->strm).next_in = state->in;
    }
    state_local._4_4_ = 0;
  }
  else {
    state_local._4_4_ = -1;
  }
  return state_local._4_4_;
}

Assistant:

local int gz_avail(gz_statep state)
{
    z_streamp strm = &(state->strm);

    if (state->err != Z_OK)
        return -1;
    if (state->eof == 0) {
        if (gz_load(state, state->in, state->size,
                (unsigned *)&(strm->avail_in)) == -1)
            return -1;
        strm->next_in = state->in;
    }
    return 0;
}